

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O1

void rlUnloadVertexArray(uint vaoId)

{
  uint in_EDI;
  uint local_c;
  
  if (RLGL.ExtSupported.vao) {
    local_c = in_EDI;
    (*glad_glBindVertexArray)(0);
    (*glad_glDeleteVertexArrays)(1,&local_c);
    TraceLog(3,"VAO: [ID %i] Unloaded vertex array data from VRAM (GPU)",(ulong)local_c);
  }
  return;
}

Assistant:

void rlUnloadVertexArray(unsigned int vaoId)
{
#if defined(GRAPHICS_API_OPENGL_33) || defined(GRAPHICS_API_OPENGL_ES2)
    if (RLGL.ExtSupported.vao)
    {
        glBindVertexArray(0);
        glDeleteVertexArrays(1, &vaoId);
        TRACELOG(LOG_INFO, "VAO: [ID %i] Unloaded vertex array data from VRAM (GPU)", vaoId);
    }
#endif
}